

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

int evutil_fast_socket_nonblocking(int fd)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = fcntl(fd,4,0x800);
  if (iVar1 == -1) {
    event_warn("fcntl(%d, F_SETFL)",fd);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
evutil_fast_socket_nonblocking(evutil_socket_t fd)
{
#ifdef _WIN32
	return evutil_make_socket_nonblocking(fd);
#else
	if (fcntl(fd, F_SETFL, O_NONBLOCK) == -1) {
		event_warn("fcntl(%d, F_SETFL)", fd);
		return -1;
	}
	return 0;
#endif
}